

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VLinearSum_Serial(realtype a,N_Vector x,realtype b,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  N_Vector local_b8;
  N_Vector local_a0;
  N_Vector local_88;
  int test;
  N_Vector v2;
  N_Vector v1;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  realtype c;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector y_local;
  realtype b_local;
  N_Vector x_local;
  realtype a_local;
  
  if (((b != 1.0) || (NAN(b))) || (z != y)) {
    if (((a != 1.0) || (NAN(a))) || (z != x)) {
      if (((a != 1.0) || (NAN(a))) || ((b != 1.0 || (NAN(b))))) {
        bVar5 = false;
        if ((a == 1.0) && (!NAN(a))) {
          bVar5 = b == -1.0;
        }
        if ((bVar5) || ((((a == -1.0 && (!NAN(a))) && (b == 1.0)) && (!NAN(b))))) {
          local_88 = y;
          if (bVar5) {
            local_88 = x;
            x = y;
          }
          VDiff_Serial(local_88,x,z);
        }
        else if ((a == 1.0) || ((b == 1.0 && (!NAN(b))))) {
          local_a0 = y;
          if (a == 1.0) {
            local_a0 = x;
            a = b;
            x = y;
          }
          VLin1_Serial(a,x,local_a0,z);
        }
        else if ((a == -1.0) || ((b == -1.0 && (!NAN(b))))) {
          local_b8 = y;
          if (a == -1.0) {
            local_b8 = x;
            a = b;
            x = y;
          }
          VLin2_Serial(a,x,local_b8,z);
        }
        else if ((a != b) || (NAN(a) || NAN(b))) {
          if ((a != -b) || (NAN(a) || NAN(-b))) {
            lVar1 = *x->content;
            lVar2 = *(long *)((long)x->content + 0x10);
            lVar3 = *(long *)((long)y->content + 0x10);
            lVar4 = *(long *)((long)z->content + 0x10);
            for (N = 0; N < lVar1; N = N + 1) {
              *(double *)(lVar4 + N * 8) =
                   a * *(double *)(lVar2 + N * 8) + b * *(double *)(lVar3 + N * 8);
            }
          }
          else {
            VScaleDiff_Serial(a,x,y,z);
          }
        }
        else {
          VScaleSum_Serial(a,x,y,z);
        }
      }
      else {
        VSum_Serial(x,y,z);
      }
    }
    else {
      Vaxpy_Serial(b,y,x);
    }
  }
  else {
    Vaxpy_Serial(a,x,y);
  }
  return;
}

Assistant:

void N_VLinearSum_Serial(realtype a, N_Vector x, realtype b, N_Vector y, N_Vector z)
{
  sunindextype i, N;
  realtype c, *xd, *yd, *zd;
  N_Vector v1, v2;
  booleantype test;

  xd = yd = zd = NULL;

  if ((b == ONE) && (z == y)) {    /* BLAS usage: axpy y <- ax+y */
    Vaxpy_Serial(a,x,y);
    return;
  }

  if ((a == ONE) && (z == x)) {    /* BLAS usage: axpy x <- by+x */
    Vaxpy_Serial(b,y,x);
    return;
  }

  /* Case: a == b == 1.0 */

  if ((a == ONE) && (b == ONE)) {
    VSum_Serial(x, y, z);
    return;
  }

  /* Cases: (1) a == 1.0, b = -1.0, (2) a == -1.0, b == 1.0 */

  if ((test = ((a == ONE) && (b == -ONE))) || ((a == -ONE) && (b == ONE))) {
    v1 = test ? y : x;
    v2 = test ? x : y;
    VDiff_Serial(v2, v1, z);
    return;
  }

  /* Cases: (1) a == 1.0, b == other or 0.0, (2) a == other or 0.0, b == 1.0 */
  /* if a or b is 0.0, then user should have called N_VScale */

  if ((test = (a == ONE)) || (b == ONE)) {
    c  = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin1_Serial(c, v1, v2, z);
    return;
  }

  /* Cases: (1) a == -1.0, b != 1.0, (2) a != 1.0, b == -1.0 */

  if ((test = (a == -ONE)) || (b == -ONE)) {
    c = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin2_Serial(c, v1, v2, z);
    return;
  }

  /* Case: a == b */
  /* catches case both a and b are 0.0 - user should have called N_VConst */

  if (a == b) {
    VScaleSum_Serial(a, x, y, z);
    return;
  }

  /* Case: a == -b */

  if (a == -b) {
    VScaleDiff_Serial(a, x, y, z);
    return;
  }

  /* Do all cases not handled above:
     (1) a == other, b == 0.0 - user should have called N_VScale
     (2) a == 0.0, b == other - user should have called N_VScale
     (3) a,b == other, a !=b, a != -b */

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = (a*xd[i])+(b*yd[i]);

  return;
}